

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv.h
# Opt level: O1

int_mv gm_get_motion_vector
                 (WarpedMotionParams *gm,int allow_hp,BLOCK_SIZE bsize,int mi_col,int mi_row,
                 int is_integer)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  
  if (gm->wmtype == '\0') {
    uVar2 = 0;
    uVar1 = 0;
  }
  else {
    if (gm->wmtype == '\x01') {
      uVar1 = (uint)gm->wmmat[0] >> 0xd;
      uVar2 = (uint)gm->wmmat[1] >> 0xd;
    }
    else {
      iVar4 = (uint)(block_size_wide[bsize] >> 1) + mi_col * 4 + -1;
      iVar3 = (uint)(block_size_high[bsize] >> 1) + mi_row * 4 + -1;
      iVar7 = (gm->wmmat[2] + -0x10000) * iVar4 + gm->wmmat[0] + gm->wmmat[3] * iVar3;
      if (allow_hp == 0) {
        if (iVar7 < 0) {
          uVar2 = -(0x2000U - iVar7 >> 0xe);
        }
        else {
          uVar2 = iVar7 + 0x2000U >> 0xe;
        }
        uVar2 = uVar2 * 2;
      }
      else if (iVar7 < 0) {
        uVar2 = -(0x1000U - iVar7 >> 0xd);
      }
      else {
        uVar2 = iVar7 + 0x1000U >> 0xd;
      }
      iVar3 = iVar4 * gm->wmmat[4] + gm->wmmat[1] + (gm->wmmat[5] + -0x10000) * iVar3;
      if (allow_hp == 0) {
        if (iVar3 < 0) {
          uVar1 = -(0x2000U - iVar3 >> 0xe);
        }
        else {
          uVar1 = iVar3 + 0x2000U >> 0xe;
        }
        uVar1 = uVar1 * 2;
      }
      else if (iVar3 < 0) {
        uVar1 = -(0x1000U - iVar3 >> 0xd);
      }
      else {
        uVar1 = iVar3 + 0x1000U >> 0xd;
      }
    }
    if (is_integer != 0) {
      uVar5 = (int)(short)uVar1 % 8;
      if (uVar5 != 0) {
        uVar1 = uVar1 - uVar5;
        uVar6 = -uVar5;
        if (0 < (int)uVar5) {
          uVar6 = uVar5;
        }
        if (4 < uVar6) {
          if ((int)uVar5 < 1) {
            uVar1 = uVar1 - 8;
          }
          else {
            uVar1 = uVar1 + 8;
          }
        }
      }
      uVar5 = (int)(short)uVar2 % 8;
      if (uVar5 != 0) {
        uVar2 = uVar2 - uVar5;
        uVar6 = -uVar5;
        if (0 < (int)uVar5) {
          uVar6 = uVar5;
        }
        if (4 < uVar6) {
          if ((int)uVar5 < 1) {
            uVar2 = uVar2 - 8;
          }
          else {
            uVar2 = uVar2 + 8;
          }
        }
      }
    }
  }
  return (int_mv)(uVar1 & 0xffff | uVar2 << 0x10);
}

Assistant:

static inline int_mv gm_get_motion_vector(const WarpedMotionParams *gm,
                                          int allow_hp, BLOCK_SIZE bsize,
                                          int mi_col, int mi_row,
                                          int is_integer) {
  int_mv res;

  if (gm->wmtype == IDENTITY) {
    res.as_int = 0;
    return res;
  }

  const int32_t *mat = gm->wmmat;
  int x, y, tx, ty;

  if (gm->wmtype == TRANSLATION) {
    // All global motion vectors are stored with WARPEDMODEL_PREC_BITS (16)
    // bits of fractional precision. The offset for a translation is stored in
    // entries 0 and 1. For translations, all but the top three (two if
    // cm->features.allow_high_precision_mv is false) fractional bits are always
    // zero.
    //
    // After the right shifts, there are 3 fractional bits of precision. If
    // allow_hp is false, the bottom bit is always zero (so we don't need a
    // call to convert_to_trans_prec here)
    //
    // Note: There is an AV1 specification bug here:
    //
    // gm->wmmat[0] is supposed to be the horizontal translation, and so should
    // go into res.as_mv.col, and gm->wmmat[1] is supposed to be the vertical
    // translation and so should go into res.as_mv.row
    //
    // However, in the spec, these assignments are accidentally reversed, and so
    // we must keep this incorrect logic to match the spec.
    //
    // See also: https://crbug.com/aomedia/3328
    res.as_mv.row = gm->wmmat[0] >> GM_TRANS_ONLY_PREC_DIFF;
    res.as_mv.col = gm->wmmat[1] >> GM_TRANS_ONLY_PREC_DIFF;
    assert(IMPLIES(1 & (res.as_mv.row | res.as_mv.col), allow_hp));
    if (is_integer) {
      integer_mv_precision(&res.as_mv);
    }
    return res;
  }

  x = block_center_x(mi_col, bsize);
  y = block_center_y(mi_row, bsize);

  if (gm->wmtype == ROTZOOM) {
    assert(gm->wmmat[5] == gm->wmmat[2]);
    assert(gm->wmmat[4] == -gm->wmmat[3]);
  }

  const int xc =
      (mat[2] - (1 << WARPEDMODEL_PREC_BITS)) * x + mat[3] * y + mat[0];
  const int yc =
      mat[4] * x + (mat[5] - (1 << WARPEDMODEL_PREC_BITS)) * y + mat[1];
  tx = convert_to_trans_prec(allow_hp, xc);
  ty = convert_to_trans_prec(allow_hp, yc);

  res.as_mv.row = ty;
  res.as_mv.col = tx;

  if (is_integer) {
    integer_mv_precision(&res.as_mv);
  }
  return res;
}